

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

void iDynTree::reportWarning(char *className,char *methodName,char *errorMessage)

{
  ostream *poVar1;
  char *in_RDX;
  char *in_RSI;
  char *in_RDI;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"[WARNING] ");
  poVar1 = std::operator<<(poVar1,in_RDI);
  poVar1 = std::operator<<(poVar1," :: ");
  poVar1 = std::operator<<(poVar1,in_RSI);
  poVar1 = std::operator<<(poVar1," : ");
  poVar1 = std::operator<<(poVar1,in_RDX);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void reportWarning(const char* className, const char* methodName, const char* errorMessage)
    {
        std::cerr << "[WARNING] " << className << " :: " << methodName << " : " << errorMessage <<  "\n";
    }